

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall cmListFileParser::~cmListFileParser(cmListFileParser *this)

{
  cmListFileParser *this_local;
  
  cmListFileLexer_Delete(this->Lexer);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
            (&this->FunctionArguments);
  std::__cxx11::string::~string((string *)&this->FunctionName);
  cmListFileBacktrace::~cmListFileBacktrace(&this->Backtrace);
  return;
}

Assistant:

cmListFileParser::~cmListFileParser()
{
  cmListFileLexer_Delete(this->Lexer);
}